

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_reset_stream(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                       quicly_sent_t *sent)

{
  uint64_t uVar1;
  quicly_stream_t *stream;
  
  stream = quicly_get_stream((quicly_conn_t *)&map[-0x28].num_packets,(sent->data).stream.stream_id)
  ;
  if ((((stream != (quicly_stream_t *)0x0) &&
       ((stream->_send_aux).reset_stream.sender_state =
             (uint)(acked != 0) * 2 + QUICLY_SENDER_STATE_SEND,
       (stream->recvstate).received.num_ranges == 0)) &&
      (uVar1 = (stream->sendstate).final_size, uVar1 != 0xffffffffffffffff)) &&
     (((stream->sendstate).acked.ranges)->end == uVar1 + 1 && acked != 0)) {
    destroy_stream(stream,0);
  }
  return 0;
}

Assistant:

static int on_ack_reset_stream(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_state_sender.stream_id)) != NULL) {
        on_ack_stream_state_sender(&stream->_send_aux.reset_stream.sender_state, acked);
        if (stream_is_destroyable(stream))
            destroy_stream(stream, 0);
    }

    return 0;
}